

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalogManager.cpp
# Opt level: O3

void __thiscall catalog::descTable(catalog *this,string *tableName)

{
  pointer pcVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  long *plVar5;
  TableInfo *pTVar6;
  ostream *poVar7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  long lVar11;
  string local_50;
  
  pcVar1 = (tableName->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + tableName->_M_string_length);
  uVar3 = existTable(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((int)uVar3 < 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"no such table",0xd);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"tableName : ",0xc);
    pTVar6 = (this->TableInfoList).super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar3];
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(pTVar6->tableName)._M_dataplus._M_p,
               (pTVar6->tableName)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\tattributeNum : ",0x10);
    plVar5 = (long *)std::ostream::operator<<
                               (&std::cout,
                                (this->TableInfoList).
                                super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar3]->attributeNum);
    std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
    std::ostream::put((char)plVar5);
    std::ostream::flush();
    pTVar6 = (this->TableInfoList).super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar3];
    if (0 < pTVar6->attributeNum) {
      lVar11 = 0;
      do {
        lVar2 = *(long *)&(pTVar6->attributeName).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data;
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,*(char **)(lVar2 + lVar11 * 0x20),
                            *(long *)(lVar2 + 8 + lVar11 * 0x20));
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t",1);
        poVar7 = (ostream *)
                 std::ostream::operator<<
                           (poVar7,*(int *)(*(long *)&((this->TableInfoList).
                                                                                                              
                                                  super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar3]->
                                                  type).
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data + lVar11 * 4));
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\t",1);
        std::ostream::operator<<
                  (poVar7,*(int *)(*(long *)&((this->TableInfoList).
                                              super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>
                                              ._M_impl.super__Vector_impl_data._M_start[uVar3]->
                                             constraint).
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data + lVar11 * 4));
        iVar4 = *(int *)(*(long *)&((this->TableInfoList).
                                    super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start[uVar3]->constraint).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data + lVar11 * 4);
        if (iVar4 == 3) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\tprimary key ",0xd);
          iVar4 = *(int *)(*(long *)&((this->TableInfoList).
                                      super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
                                      _M_impl.super__Vector_impl_data._M_start[uVar3]->constraint).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data + lVar11 * 4);
        }
        if (iVar4 == 4) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tindex ",7);
          pTVar6 = (this->TableInfoList).
                   super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar3];
          p_Var10 = *(_Base_ptr *)((long)&(pTVar6->indexInfo)._M_t._M_impl + 0x10);
          p_Var8 = (_Base_ptr)((long)&(pTVar6->indexInfo)._M_t._M_impl + 8);
          p_Var9 = p_Var8;
          if (p_Var10 != (_Base_ptr)0x0) {
            do {
              if (lVar11 <= (int)p_Var10[1]._M_color) {
                p_Var9 = p_Var10;
              }
              p_Var10 = (&p_Var10->_M_left)[(int)p_Var10[1]._M_color < lVar11];
            } while (p_Var10 != (_Base_ptr)0x0);
            if ((p_Var9 != p_Var8) && ((int)p_Var9[1]._M_color <= lVar11)) {
              p_Var8 = p_Var9;
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(char *)p_Var8[1]._M_parent,(long)p_Var8[1]._M_left);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        lVar11 = lVar11 + 1;
        pTVar6 = (this->TableInfoList).super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar3];
      } while (lVar11 < pTVar6->attributeNum);
    }
  }
  return;
}

Assistant:

void catalog::descTable(std::string tableName){
    int pos = existTable(tableName);
    if(pos < 0){
        std::cout<<"no such table"<<std::endl;
        return;
    }
    std::cout<<"tableName : "<<TableInfoList[pos]->tableName;
    std::cout<<"\tattributeNum : "<<TableInfoList[pos]->attributeNum<<std::endl;
    for(int j = 0 ; j < TableInfoList[pos]->attributeNum; j ++){
        std::cout<<TableInfoList[pos]->attributeName[j] << "\t"<<TableInfoList[pos]->type[j] << "\t"<<TableInfoList[pos]->constraint[j];
        if(TableInfoList[pos]->constraint[j] == 3)std::cout<<"\tprimary key ";
        if(TableInfoList[pos]->constraint[j] == 4)std::cout<<"\tindex "<<TableInfoList[pos]->indexInfo.find(j)->second;
        std::cout<<"\n";
    }

}